

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corealloc.h
# Opt level: O1

void __thiscall
snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
dealloc_local_object_meta
          (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *this,
          PagemapEntry *entry,BackendSlabMetadata *meta)

{
  short *psVar1;
  Ticker<snmalloc::PALLinux> *pTVar2;
  undefined2 uVar3;
  Node *pNVar4;
  ushort uVar5;
  ulong sizeclass;
  
  sizeclass = (ulong)((uint)(entry->
                            super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                            ).super_MetaEntryBase.remote_and_sizeclass & 0x3f);
  if ((meta->
      super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
      ).free_queue.field_0x14 == '\x01') {
    *(short *)&(meta->
               super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
               ).free_queue.field_0x12 =
         (short)*(undefined4 *)(sizeclass_metadata + sizeclass * 4 + 0x1100) -
         (short)((uint)*(undefined4 *)(sizeclass_metadata + sizeclass * 4 + 0x1100) >> 0x10);
    (meta->
    super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
    ).free_queue.field_0x14 = 0;
    pNVar4 = (meta->
             super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
             ).node.next;
    pNVar4->prev = (meta->
                   super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
                   ).node.prev;
    ((meta->
     super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
     ).node.prev)->next = pNVar4;
    pNVar4 = (Node *)(this->alloc_classes + sizeclass);
    (meta->
    super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
    ).node.next = pNVar4->next;
    pNVar4->next->prev = (Node *)meta;
    (meta->
    super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
    ).node.prev = pNVar4;
    pNVar4->next = (Node *)meta;
    psVar1 = (short *)((long)&pNVar4[1].next + 2);
    *psVar1 = *psVar1 + 1;
  }
  else {
    uVar3 = this->alloc_classes[sizeclass].unused;
    uVar5 = uVar3 + 1;
    this->alloc_classes[sizeclass].unused = uVar5;
    if ((2 < uVar5) && (this->alloc_classes[sizeclass].length >> 2 < uVar5)) {
      dealloc_local_slabs<false>(this,sizeclass);
    }
  }
  pTVar2 = &this->ticker;
  pTVar2->count_down = pTVar2->count_down - 1;
  if (pTVar2->count_down != 0) {
    return;
  }
  Ticker<snmalloc::PALLinux>::check_tick_slow<void*>(&this->ticker,(void *)0x0);
  return;
}

Assistant:

SNMALLOC_SLOW_PATH void dealloc_local_object_meta(
      const PagemapEntry& entry, BackendSlabMetadata* meta)
    {
      smallsizeclass_t sizeclass = entry.get_sizeclass().as_small();

      if (meta->is_sleeping())
      {
        // Slab has been woken up add this to the list of slabs with free space.

        //  Wake slab up.
        meta->set_not_sleeping(sizeclass);

        // Remove from set of fully used slabs.
        meta->node.remove();

        alloc_classes[sizeclass].available.insert(meta);
        alloc_classes[sizeclass].length++;

#ifdef SNMALLOC_TRACING
        message<1024>("Slab is woken up");
#endif

        ticker.check_tick();
        return;
      }

      alloc_classes[sizeclass].unused++;

      // If we have several slabs, and it isn't too expensive as a proportion
      // return to the global pool.
      if (
        (alloc_classes[sizeclass].unused > 2) &&
        (alloc_classes[sizeclass].unused >
         (alloc_classes[sizeclass].length >> 2)))
      {
        dealloc_local_slabs(sizeclass);
      }
      ticker.check_tick();
    }